

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O3

optional<float> __thiscall pbrt::PiecewiseConstant1D::Invert(PiecewiseConstant1D *this,Float x)

{
  float fVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  int iVar5;
  long in_RSI;
  int iVar6;
  undefined4 in_XMM3_Da;
  undefined1 in_register_000012c4 [12];
  
  fVar1 = *(float *)(in_RSI + 0x40);
  if ((fVar1 <= x) && (x <= *(float *)(in_RSI + 0x44))) {
    auVar2._4_12_ = in_register_000012c4;
    auVar2._0_4_ = in_XMM3_Da;
    auVar2 = vcvtusi2ss_avx512f(auVar2,*(long *)(in_RSI + 0x18));
    uVar4 = *(long *)(in_RSI + 0x18) - 1;
    fVar1 = ((x - fVar1) / (*(float *)(in_RSI + 0x44) - fVar1)) * auVar2._0_4_;
    iVar5 = (int)fVar1;
    iVar3 = (int)uVar4;
    if ((ulong)(long)iVar5 <= uVar4) {
      iVar3 = iVar5;
    }
    iVar6 = 0;
    if (-1 < iVar5) {
      iVar6 = iVar3;
    }
    fVar1 = fVar1 - (float)iVar6;
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * *(float *)(*(long *)(in_RSI + 0x28) + 4 +
                                                              (long)iVar6 * 4))),
                             ZEXT416((uint)(1.0 - fVar1)),
                             ZEXT416(*(uint *)(*(long *)(in_RSI + 0x28) + (long)iVar6 * 4)));
    *(undefined1 *)((long)&(this->func).alloc.memoryResource + 4) = 1;
    *(int *)&(this->func).alloc.memoryResource = auVar2._0_4_;
    return (optional<float>)this;
  }
  (this->func).alloc.memoryResource = (memory_resource *)0x0;
  return (optional<float>)this;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<Float> Invert(Float x) const {
        // Compute offset to CDF values that bracket $x$
        if (x < min || x > max)
            return {};
        Float c = (x - min) / (max - min) * func.size();
        int offset = Clamp(int(c), 0, func.size() - 1);
        DCHECK(offset >= 0 && offset + 1 < cdf.size());

        // Linearly interpolate between adjacent CDF values to find sample value
        Float delta = c - offset;
        return Lerp(delta, cdf[offset], cdf[offset + 1]);
    }